

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

void __thiscall wasm::TranslateToFuzzReader::addImportTableSupport(TranslateToFuzzReader *this)

{
  Module *pMVar1;
  unique_ptr *puVar2;
  variant<wasm::Name,_wasm::HeapType> value;
  bool bVar3;
  long lVar4;
  pointer pFVar5;
  Name NVar6;
  Type local_188;
  HeapType local_180;
  Type local_178;
  Type local_170;
  Type *local_168;
  undefined8 local_160;
  Type local_158;
  Signature local_150;
  HeapType local_140;
  Name local_138;
  Name local_128;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> local_118;
  __single_object func_1;
  string_view local_100;
  HeapType local_f0;
  Type local_e8;
  Type local_e0;
  Type *local_d8;
  undefined8 local_d0;
  Type local_c8;
  Signature local_c0;
  HeapType local_b0;
  Name local_a8;
  Name local_98;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> local_88;
  __single_object func;
  string_view local_70 [2];
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  string_view local_38;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> local_28;
  Name local_20;
  TranslateToFuzzReader *local_10;
  TranslateToFuzzReader *this_local;
  
  local_10 = this;
  bVar3 = IString::operator_cast_to_bool(&(this->funcrefTableName).super_IString);
  if (bVar3) {
    pMVar1 = this->wasm;
    Name::Name(&local_20,"table");
    NVar6.super_IString.str._M_str = (char *)local_20.super_IString.str._M_len;
    NVar6.super_IString.str._M_len = (size_t)pMVar1;
    lVar4 = wasm::Module::getExportOrNull(NVar6);
    if ((lVar4 == 0) && ((this->preserveImportsAndExports & 1U) == 0)) {
      puVar2 = (unique_ptr *)this->wasm;
      Name::Name((Name *)&local_38,"table");
      std::variant<wasm::Name,wasm::HeapType>::variant<wasm::Name&,void,void,wasm::Name,void>
                ((variant<wasm::Name,wasm::HeapType> *)&local_50,&this->funcrefTableName);
      value.super__Variant_base<wasm::Name,_wasm::HeapType>.
      super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
      super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
      super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
      super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
      super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u._M_first._M_storage.
      super_IString.str._M_str = (char *)uStack_48;
      value.super__Variant_base<wasm::Name,_wasm::HeapType>.
      super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
      super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
      super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
      super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
      super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u._M_first._M_storage.
      super_IString.str._M_len = local_50;
      value.super__Variant_base<wasm::Name,_wasm::HeapType>.
      super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
      super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
      super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
      super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
      super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._16_8_ = local_40;
      Builder::makeExport((Builder *)&local_28,(Name)local_38,value,Table);
      wasm::Module::addExport(puVar2);
      std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::~unique_ptr(&local_28);
      pMVar1 = this->wasm;
      Name::Name((Name *)&func,"table-get");
      local_70[0] = (string_view)Names::getValidFunctionName(pMVar1,(Name)_func);
      Name::operator=(&this->tableGetImportName,(Name *)local_70);
      std::make_unique<wasm::Function>();
      pFVar5 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                         (&local_88);
      Name::operator=((Name *)pFVar5,&this->tableGetImportName);
      Name::Name(&local_98,"fuzzing-support");
      pFVar5 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                         (&local_88);
      Name::operator=(&(pFVar5->super_Importable).module,&local_98);
      Name::Name(&local_a8,"table-get");
      pFVar5 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                         (&local_88);
      Name::operator=(&(pFVar5->super_Importable).base,&local_a8);
      Type::Type(&local_e0,i32);
      local_d8 = &local_e0;
      local_d0 = 1;
      wasm::Type::Type(&local_c8,local_d8,1);
      HeapType::HeapType(&local_f0,func);
      Type::Type(&local_e8,local_f0,Nullable,Inexact);
      Signature::Signature(&local_c0,local_c8,local_e8);
      wasm::HeapType::HeapType(&local_b0,local_c0);
      pFVar5 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                         (&local_88);
      (pFVar5->type).id = local_b0.id;
      wasm::Module::addFunction((unique_ptr *)this->wasm);
      std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr(&local_88);
      pMVar1 = this->wasm;
      Name::Name((Name *)&func_1,"table-set");
      local_100 = (string_view)Names::getValidFunctionName(pMVar1,(Name)_func_1);
      Name::operator=(&this->tableSetImportName,(Name *)&local_100);
      std::make_unique<wasm::Function>();
      pFVar5 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                         (&local_118);
      Name::operator=((Name *)pFVar5,&this->tableSetImportName);
      Name::Name(&local_128,"fuzzing-support");
      pFVar5 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                         (&local_118);
      Name::operator=(&(pFVar5->super_Importable).module,&local_128);
      Name::Name(&local_138,"table-set");
      pFVar5 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                         (&local_118);
      Name::operator=(&(pFVar5->super_Importable).base,&local_138);
      Type::Type(&local_178,i32);
      HeapType::HeapType(&local_180,func);
      Type::Type(&local_170,local_180,Nullable,Inexact);
      local_168 = &local_178;
      local_160 = 2;
      wasm::Type::Type(&local_158,local_168,2);
      Type::Type(&local_188,none);
      Signature::Signature(&local_150,local_158,local_188);
      wasm::HeapType::HeapType(&local_140,local_150);
      pFVar5 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                         (&local_118);
      (pFVar5->type).id = local_140.id;
      wasm::Module::addFunction((unique_ptr *)this->wasm);
      std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr(&local_118)
      ;
    }
  }
  return;
}

Assistant:

void TranslateToFuzzReader::addImportTableSupport() {
  // For the table imports to be able to do anything, we must export a table
  // for them. For simplicity, use the funcref table we use internally, though
  // we could pick one at random, support non-funcref ones, and even export
  // multiple ones TODO
  if (!funcrefTableName) {
    return;
  }

  // If a "table" export already exists, skip fuzzing these imports, as the
  // current export may not contain a valid table for it. We also skip if we are
  // not adding imports or exports.
  if (wasm.getExportOrNull("table") || preserveImportsAndExports) {
    return;
  }

  // Export the table.
  wasm.addExport(
    builder.makeExport("table", funcrefTableName, ExternalKind::Table));

  // Get from the table.
  {
    tableGetImportName = Names::getValidFunctionName(wasm, "table-get");
    auto func = std::make_unique<Function>();
    func->name = tableGetImportName;
    func->module = "fuzzing-support";
    func->base = "table-get";
    func->type = Signature({Type::i32}, Type(HeapType::func, Nullable));
    wasm.addFunction(std::move(func));
  }

  // Set into the table.
  {
    tableSetImportName = Names::getValidFunctionName(wasm, "table-set");
    auto func = std::make_unique<Function>();
    func->name = tableSetImportName;
    func->module = "fuzzing-support";
    func->base = "table-set";
    func->type =
      Signature({Type::i32, Type(HeapType::func, Nullable)}, Type::none);
    wasm.addFunction(std::move(func));
  }
}